

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_example(_Bool copy_on_write)

{
  _Bool _Var1;
  _Bool _Var2;
  roaring_bitmap_t *prVar3;
  uint64_t uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *__ptr;
  roaring_bitmap_t *x2;
  roaring_uint32_iterator_t *prVar8;
  byte in_DIL;
  uint32_t j;
  uint32_t ret;
  uint32_t buffer [256];
  roaring_uint32_iterator_t *i;
  uint32_t counter;
  char *internal_reason_buf_14;
  size_t sizeofbitmap;
  char *internal_reason_buf_13;
  roaring_bitmap_t *t;
  size_t actualsize;
  char *serializedbytes;
  uint32_t expectedsize;
  char *internal_reason_buf_12;
  roaring_bitmap_t *i1_2;
  char *internal_reason_buf_11;
  roaring_bitmap_t *bigxor;
  roaring_bitmap_t *allmybitmaps_x [3];
  char *internal_reason_buf_10;
  roaring_bitmap_t *rx1_2_3;
  char *internal_reason_buf_9;
  roaring_bitmap_t *bigunionheap;
  char *internal_reason_buf_8;
  roaring_bitmap_t *bigunion;
  roaring_bitmap_t *allmybitmaps [3];
  char *internal_reason_buf_7;
  roaring_bitmap_t *r1_2_3;
  char *internal_reason_buf_6;
  roaring_bitmap_t *z;
  char *internal_reason_buf_5;
  roaring_bitmap_t *r1f;
  uint32_t *arr3;
  size_t limit;
  size_t offset;
  uint32_t *arr1;
  uint64_t card1;
  char *internal_reason_buf_4;
  roaring_bitmap_t *r3;
  uint32_t values [3];
  char *internal_reason_buf_3;
  roaring_bitmap_t *r2;
  uint32_t compact_size;
  char *internal_reason_buf_2;
  uint32_t size;
  uint32_t cardinality;
  char *internal_reason_buf_1;
  uint32_t i_1;
  char *internal_reason_buf;
  roaring_bitmap_t *r1;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  roaring_bitmap_t *in_stack_fffffffffffffa30;
  roaring_bitmap_t *in_stack_fffffffffffffa38;
  uint in_stack_fffffffffffffa40;
  uint32_t in_stack_fffffffffffffa44;
  roaring_uint32_iterator_t *in_stack_fffffffffffffa48;
  roaring_bitmap_t *in_stack_fffffffffffffa58;
  roaring_bitmap_t *in_stack_fffffffffffffa60;
  uint32_t in_stack_fffffffffffffa6c;
  roaring_bitmap_t *in_stack_fffffffffffffa70;
  roaring_bitmap_t *in_stack_fffffffffffffa78;
  roaring_bitmap_t *in_stack_fffffffffffffa80;
  roaring_bitmap_t *in_stack_fffffffffffffa88;
  roaring_bitmap_t *in_stack_fffffffffffffa90;
  roaring_bitmap_t *in_stack_fffffffffffffac0;
  roaring_bitmap_t *in_stack_fffffffffffffac8;
  roaring_bitmap_t **in_stack_fffffffffffffae0;
  uint32_t in_stack_fffffffffffffaec;
  uint local_1c;
  
  _Var1 = (_Bool)(in_DIL & 1);
  prVar3 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar3,_Var1);
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  for (local_1c = 100; local_1c < 1000; local_1c = local_1c + 1) {
    roaring_bitmap_add(in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c);
    _Var2 = roaring_bitmap_internal_validate
                      ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                       (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
    if (!_Var2) {
      print_error("ERROR: internal validation failed: %s\n",0);
      _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
    }
  }
  roaring_bitmap_contains
            (in_stack_fffffffffffffa38,(uint32_t)((ulong)in_stack_fffffffffffffa30 >> 0x20));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  uVar4 = roaring_bitmap_get_cardinality
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  printf("Cardinality = %d \n",uVar4 & 0xffffffff);
  sVar5 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x104648);
  roaring_bitmap_run_optimize
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  sVar6 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x1046bb);
  printf("size before run optimize %d bytes, and after %d bytes\n",sVar5 & 0xffffffff,
         sVar6 & 0xffffffff);
  roaring_bitmap_of_ptr
            ((size_t)in_stack_fffffffffffffa30,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  roaring_bitmap_printf(in_stack_fffffffffffffa30);
  prVar3 = roaring_bitmap_of_ptr
                     ((size_t)in_stack_fffffffffffffa30,
                      (uint32_t *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  roaring_bitmap_set_copy_on_write(prVar3,_Var1);
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  uVar4 = roaring_bitmap_get_cardinality
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  pvVar7 = malloc(uVar4 << 2);
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  roaring_bitmap_to_uint32_array
            (in_stack_fffffffffffffa30,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  __ptr = malloc(4000);
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  roaring_bitmap_range_uint32_array
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (size_t)in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  free(__ptr);
  roaring_bitmap_of_ptr
            ((size_t)in_stack_fffffffffffffa30,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  free(pvVar7);
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x104a24);
  prVar3 = roaring_bitmap_copy((roaring_bitmap_t *)in_stack_fffffffffffffa48);
  roaring_bitmap_set_copy_on_write(prVar3,_Var1);
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (char *)in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x104ae5);
  prVar3 = roaring_bitmap_or(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  x2 = (roaring_bitmap_t *)
       roaring_bitmap_get_cardinality
                 ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40))
  ;
  roaring_bitmap_or_cardinality
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),x2);
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  roaring_bitmap_set_copy_on_write(prVar3,_Var1);
  roaring_bitmap_or_inplace(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  roaring_bitmap_or_many((size_t)x2,(roaring_bitmap_t **)in_stack_fffffffffffffa30);
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  roaring_bitmap_or_many_heap(in_stack_fffffffffffffaec,in_stack_fffffffffffffae0);
  _Var2 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var2) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x104d54);
  roaring_bitmap_free((roaring_bitmap_t *)0x104d61);
  roaring_bitmap_free((roaring_bitmap_t *)0x104d6e);
  prVar3 = roaring_bitmap_xor(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  roaring_bitmap_set_copy_on_write(prVar3,_Var1);
  _Var1 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_xor_inplace(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  roaring_bitmap_xor_many((size_t)x2,(roaring_bitmap_t **)in_stack_fffffffffffffa30);
  _Var1 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x104ee8);
  roaring_bitmap_free((roaring_bitmap_t *)0x104ef5);
  roaring_bitmap_and(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  _Var1 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  }
  prVar3 = (roaring_bitmap_t *)
           roaring_bitmap_get_cardinality
                     ((roaring_bitmap_t *)
                      CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  roaring_bitmap_and_cardinality(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)prVar3,in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x104fc6);
  sVar5 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x104fd3);
  pvVar7 = malloc(sVar5 & 0xffffffff);
  roaring_bitmap_portable_serialize
            (prVar3,(char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  _assert_int_equal(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(unsigned_long)x2,
                    (char *)prVar3,in_stack_fffffffffffffa2c);
  roaring_bitmap_portable_deserialize((char *)0x10503c);
  _Var1 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)prVar3,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)prVar3,in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x1050d7);
  roaring_bitmap_portable_deserialize_size
            ((char *)prVar3,CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)prVar3,in_stack_fffffffffffffa2c);
  roaring_bitmap_portable_deserialize_safe
            ((char *)in_stack_fffffffffffffa48,
             CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _Var1 = roaring_bitmap_internal_validate
                    ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                     (char **)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",0);
    _fail((char *)prVar3,in_stack_fffffffffffffa2c);
  }
  roaring_bitmap_equals
            ((roaring_bitmap_t *)in_stack_fffffffffffffa48,
             (roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)prVar3,in_stack_fffffffffffffa2c);
  roaring_bitmap_free((roaring_bitmap_t *)0x1051db);
  free(pvVar7);
  roaring_iterate((roaring_bitmap_t *)in_stack_fffffffffffffa48,
                  (roaring_iterator)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),x2
                 );
  prVar8 = roaring_iterator_create
                     ((roaring_bitmap_t *)
                      CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  while ((prVar8->has_value & 1U) != 0) {
    roaring_uint32_iterator_advance
              ((roaring_uint32_iterator_t *)
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  }
  roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x10526a);
  roaring_bitmap_get_cardinality
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  _assert_true(CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),(char *)x2,
               (char *)prVar3,in_stack_fffffffffffffa2c);
  roaring_iterator_create
            ((roaring_bitmap_t *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  do {
    in_stack_fffffffffffffa44 =
         roaring_uint32_iterator_read
                   (in_stack_fffffffffffffa48,
                    (uint32_t *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                    (uint32_t)((ulong)x2 >> 0x20));
    for (in_stack_fffffffffffffa40 = 0; in_stack_fffffffffffffa40 < in_stack_fffffffffffffa44;
        in_stack_fffffffffffffa40 = in_stack_fffffffffffffa40 + 1) {
    }
  } while (0xff < in_stack_fffffffffffffa44);
  roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x105324);
  roaring_bitmap_free((roaring_bitmap_t *)0x105331);
  roaring_bitmap_free((roaring_bitmap_t *)0x10533e);
  roaring_bitmap_free((roaring_bitmap_t *)0x10534b);
  return;
}

Assistant:

void test_example(bool copy_on_write) {
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    assert_bitmap_validate(r1);
    assert_non_null(r1);

    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        roaring_bitmap_add(r1, i);
        assert_bitmap_validate(r1);
    }

    // check whether a value is contained
    assert_true(roaring_bitmap_contains(r1, 500));

    // compute how many bits there are:
    uint32_t cardinality = roaring_bitmap_get_cardinality(r1);
    printf("Cardinality = %d \n", cardinality);

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint32_t size = roaring_bitmap_portable_size_in_bytes(r1);
    roaring_bitmap_run_optimize(r1);
    assert_bitmap_validate(r1);
    uint32_t compact_size = roaring_bitmap_portable_size_in_bytes(r1);

    printf("size before run optimize %d bytes, and after %d bytes\n", size,
           compact_size);

    // create a new bitmap with varargs
    roaring_bitmap_t *r2 = roaring_bitmap_from(1, 2, 3, 5, 6);
    assert_bitmap_validate(r2);
    assert_non_null(r2);

    roaring_bitmap_printf(r2);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    roaring_bitmap_t *r3 = roaring_bitmap_of_ptr(3, values);
    roaring_bitmap_set_copy_on_write(r3, copy_on_write);
    assert_bitmap_validate(r3);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_true(arr1 != NULL);
    roaring_bitmap_to_uint32_array(r1, arr1);

    // we can go from arrays to bitmaps from "offset" by "limit"
    size_t offset = 100;
    size_t limit = 1000;
    uint32_t *arr3 = (uint32_t *)malloc(limit * sizeof(uint32_t));
    assert_true(arr3 != NULL);
    roaring_bitmap_range_uint32_array(r1, offset, limit, arr3);
    free(arr3);

    roaring_bitmap_t *r1f = roaring_bitmap_of_ptr(card1, arr1);
    assert_bitmap_validate(r1f);
    free(arr1);
    assert_non_null(r1f);

    // bitmaps shall be equal
    assert_true(roaring_bitmap_equals(r1, r1f));
    roaring_bitmap_free(r1f);

    // we can copy and compare bitmaps
    roaring_bitmap_t *z = roaring_bitmap_copy(r3);
    roaring_bitmap_set_copy_on_write(z, copy_on_write);
    assert_bitmap_validate(z);
    assert_true(roaring_bitmap_equals(r3, z));

    roaring_bitmap_free(z);

    // we can compute union two-by-two
    roaring_bitmap_t *r1_2_3 = roaring_bitmap_or(r1, r2);
    assert_bitmap_validate(r1_2_3);
    assert_true(roaring_bitmap_get_cardinality(r1_2_3) ==
                roaring_bitmap_or_cardinality(r1, r2));

    roaring_bitmap_set_copy_on_write(r1_2_3, copy_on_write);
    roaring_bitmap_or_inplace(r1_2_3, r3);

    // we can compute a big union
    const roaring_bitmap_t *allmybitmaps[] = {r1, r2, r3};
    roaring_bitmap_t *bigunion = roaring_bitmap_or_many(3, allmybitmaps);
    assert_bitmap_validate(bigunion);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunion));
    roaring_bitmap_t *bigunionheap =
        roaring_bitmap_or_many_heap(3, allmybitmaps);
    assert_bitmap_validate(bigunionheap);
    assert_true(roaring_bitmap_equals(r1_2_3, bigunionheap));
    roaring_bitmap_free(r1_2_3);
    roaring_bitmap_free(bigunion);
    roaring_bitmap_free(bigunionheap);

    // we can compute xor two-by-two
    roaring_bitmap_t *rx1_2_3 = roaring_bitmap_xor(r1, r2);
    roaring_bitmap_set_copy_on_write(rx1_2_3, copy_on_write);
    assert_bitmap_validate(rx1_2_3);
    roaring_bitmap_xor_inplace(rx1_2_3, r3);

    // we can compute a big xor
    const roaring_bitmap_t *allmybitmaps_x[] = {r1, r2, r3};
    roaring_bitmap_t *bigxor = roaring_bitmap_xor_many(3, allmybitmaps_x);
    assert_bitmap_validate(bigxor);
    assert_true(roaring_bitmap_equals(rx1_2_3, bigxor));

    roaring_bitmap_free(rx1_2_3);
    roaring_bitmap_free(bigxor);

    // we can compute intersection two-by-two
    roaring_bitmap_t *i1_2 = roaring_bitmap_and(r1, r2);
    assert_bitmap_validate(i1_2);
    assert_true(roaring_bitmap_get_cardinality(i1_2) ==
                roaring_bitmap_and_cardinality(r1, r2));

    roaring_bitmap_free(i1_2);

    // we can write a bitmap to a pointer and recover it later
    uint32_t expectedsize = roaring_bitmap_portable_size_in_bytes(r1);
    char *serializedbytes = (char *)malloc(expectedsize);
    size_t actualsize = roaring_bitmap_portable_serialize(r1, serializedbytes);
    assert_int_equal(actualsize, expectedsize);
    roaring_bitmap_t *t = roaring_bitmap_portable_deserialize(serializedbytes);
    assert_bitmap_validate(t);
    assert_true(roaring_bitmap_equals(r1, t));
    roaring_bitmap_free(t);
    // we can also check whether there is a bitmap at a memory location without
    // reading it
    size_t sizeofbitmap =
        roaring_bitmap_portable_deserialize_size(serializedbytes, expectedsize);
    assert_true(
        sizeofbitmap ==
        expectedsize);  // sizeofbitmap would be zero if no bitmap were found
    // we can also read the bitmap "safely" by specifying a byte size limit:
    t = roaring_bitmap_portable_deserialize_safe(serializedbytes, expectedsize);
    assert_bitmap_validate(t);
    assert_true(roaring_bitmap_equals(r1, t));  // what we recover is equal
    roaring_bitmap_free(t);
    free(serializedbytes);

    // we can iterate over all values using custom functions
    uint32_t counter = 0;
    roaring_iterate(r1, roaring_iterator_sumall, &counter);

    /**
     * bool roaring_iterator_sumall(uint32_t value, void *param) {
     *        *(uint32_t *) param += value;
     *        return true; // continue till the end
     *  }
     *
     */

    // we can also create iterator structs
    counter = 0;
    roaring_uint32_iterator_t *i = roaring_iterator_create(r1);
    while (i->has_value) {
        counter++;
        roaring_uint32_iterator_advance(i);
    }
    roaring_uint32_iterator_free(i);
    assert_true(roaring_bitmap_get_cardinality(r1) == counter);

    // for greater speed, you can iterate over the data in bulk
    i = roaring_iterator_create(r1);
    uint32_t buffer[256];
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(i, buffer, 256);
        for (uint32_t j = 0; j < ret; j++) {
            counter += buffer[j];
        }
        if (ret < 256) {
            break;
        }
    }
    roaring_uint32_iterator_free(i);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r3);
}